

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O1

void __thiscall
Rml::GeometryBackgroundBorder::DrawBorderCorner
          (GeometryBackgroundBorder *this,Corner corner,Vector2f pos_outer,Vector2f pos_inner,
          Vector2f pos_circle_center,float R,Vector2f r,ColourbPremultiplied color0,
          ColourbPremultiplied color1)

{
  int iVar1;
  int iVar2;
  float a0;
  float a1;
  
  if ((R == 0.0) && (!NAN(R))) {
    DrawPointPoint(this,pos_outer,pos_inner,color0,color1);
    return;
  }
  a0 = (float)(int)(corner + BOTTOM_RIGHT) * 0.5 * 3.1415927;
  a1 = (float)(int)(corner + BOTTOM_LEFT) * 0.5 * 3.1415927;
  iVar1 = Math::RoundToInteger(R / 6.0);
  iVar2 = 0x61;
  if (iVar1 < 0x61) {
    iVar2 = iVar1;
  }
  iVar1 = -1;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  if ((0.0 < r.x) && (0.0 < r.y)) {
    DrawArcArc(this,pos_circle_center,R,r,a0,a1,color0,color1,iVar1 + 3);
    return;
  }
  DrawArcPoint(this,pos_circle_center,pos_inner,R,a0,a1,color0,color1,iVar1 + 3);
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawBorderCorner(Corner corner, Vector2f pos_outer, Vector2f pos_inner, Vector2f pos_circle_center, float R,
	Vector2f r, ColourbPremultiplied color0, ColourbPremultiplied color1)
{
	const float a0 = float((int)corner + 2) * 0.5f * Math::RMLUI_PI;
	const float a1 = float((int)corner + 3) * 0.5f * Math::RMLUI_PI;

	if (R == 0)
	{
		DrawPointPoint(pos_outer, pos_inner, color0, color1);
	}
	else if (r.x > 0 && r.y > 0)
	{
		DrawArcArc(pos_circle_center, R, r, a0, a1, color0, color1, GetNumPoints(R));
	}
	else
	{
		DrawArcPoint(pos_circle_center, pos_inner, R, a0, a1, color0, color1, GetNumPoints(R));
	}
}